

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O1

void Fra_SmlSimulateOne(Fra_Sml_t *p)

{
  Aig_Obj_t *pObj;
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Aig_Man_t *pAVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  timespec ts;
  timespec local_40;
  
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    iVar1 = 1;
  }
  else {
    iVar1 = ((int)(SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8) >> 7) -
            (SUB164(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),0xc) >> 0x1f)) +
            (int)local_40.tv_sec * -1000000;
  }
  if (0 < p->nFrames) {
    iVar11 = 0;
    do {
      pVVar2 = p->pAig->vObjs;
      if (0 < pVVar2->nSize) {
        lVar8 = 0;
        do {
          pObj = (Aig_Obj_t *)pVVar2->pArray[lVar8];
          if ((pObj != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7)) {
            Fra_SmlNodeSimulate(p,pObj,iVar11);
          }
          lVar8 = lVar8 + 1;
          pVVar2 = p->pAig->vObjs;
        } while (lVar8 < pVVar2->nSize);
      }
      pAVar3 = p->pAig;
      uVar7 = pAVar3->nObjs[3] - pAVar3->nRegs;
      uVar9 = (ulong)uVar7;
      if (uVar7 != 0 && pAVar3->nRegs <= pAVar3->nObjs[3]) {
        lVar8 = 0;
        do {
          if (pAVar3->vCos->nSize <= lVar8) goto LAB_0069809e;
          Fra_SmlNodeCopyFanin(p,(Aig_Obj_t *)pAVar3->vCos->pArray[lVar8],iVar11);
          lVar8 = lVar8 + 1;
          pAVar3 = p->pAig;
          uVar9 = (long)pAVar3->nObjs[3] - (long)pAVar3->nRegs;
        } while (lVar8 < (long)uVar9);
      }
      if (iVar11 == p->nFrames + -1) break;
      pVVar2 = p->pAig->vCos;
      if ((int)uVar9 < pVVar2->nSize) {
        uVar10 = uVar9 & 0xffffffff;
        do {
          if ((int)uVar9 < 0) goto LAB_0069809e;
          Fra_SmlNodeCopyFanin(p,(Aig_Obj_t *)pVVar2->pArray[uVar10],iVar11);
          uVar10 = uVar10 + 1;
          pVVar2 = p->pAig->vCos;
        } while ((int)uVar10 < pVVar2->nSize);
      }
      pAVar3 = p->pAig;
      iVar4 = pAVar3->nRegs;
      if (0 < iVar4) {
        iVar5 = 0;
        do {
          uVar7 = (pAVar3->nObjs[3] - iVar4) + iVar5;
          if (((((int)uVar7 < 0) || (pAVar3->vCos->nSize <= (int)uVar7)) ||
              (uVar6 = (pAVar3->nObjs[2] - iVar4) + iVar5, (int)uVar6 < 0)) ||
             (pAVar3->vCis->nSize <= (int)uVar6)) {
LAB_0069809e:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          Fra_SmlNodeTransferNext
                    (p,(Aig_Obj_t *)pAVar3->vCos->pArray[uVar7],
                     (Aig_Obj_t *)pAVar3->vCis->pArray[uVar6],iVar11);
          iVar5 = iVar5 + 1;
          pAVar3 = p->pAig;
          iVar4 = pAVar3->nRegs;
        } while (iVar5 < iVar4);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 < p->nFrames);
  }
  iVar11 = clock_gettime(3,&local_40);
  if (iVar11 < 0) {
    iVar11 = -1;
  }
  else {
    iVar11 = (int)(local_40.tv_nsec / 1000) + (int)local_40.tv_sec * 1000000;
  }
  p->timeSim = p->timeSim + iVar11 + iVar1;
  p->nSimRounds = p->nSimRounds + 1;
  return;
}

Assistant:

void Fra_SmlSimulateOne( Fra_Sml_t * p )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int f, i;
    abctime clk;
clk = Abc_Clock();
    for ( f = 0; f < p->nFrames; f++ )
    {
        // simulate the nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
            Fra_SmlNodeSimulate( p, pObj, f );
        // copy simulation info into outputs
        Aig_ManForEachPoSeq( p->pAig, pObj, i )
            Fra_SmlNodeCopyFanin( p, pObj, f );
        // quit if this is the last timeframe
        if ( f == p->nFrames - 1 )
            break;
        // copy simulation info into outputs
        Aig_ManForEachLiSeq( p->pAig, pObj, i )
            Fra_SmlNodeCopyFanin( p, pObj, f );
        // copy simulation info into the inputs
        Aig_ManForEachLiLoSeq( p->pAig, pObjLi, pObjLo, i )
            Fra_SmlNodeTransferNext( p, pObjLi, pObjLo, f );
    }
p->timeSim += Abc_Clock() - clk;
p->nSimRounds++;
}